

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reslist.cpp
# Opt level: O0

ArrayResource * array_open(SRBRoot *bundle,char *tag,UString *comment,UErrorCode *status)

{
  UBool UVar1;
  ArrayResource *this;
  ArrayResource *local_60;
  LocalPointerBase<ArrayResource> local_30;
  LocalPointer<ArrayResource> res;
  UErrorCode *status_local;
  UString *comment_local;
  char *tag_local;
  SRBRoot *bundle_local;
  
  res.super_LocalPointerBase<ArrayResource>.ptr =
       (LocalPointerBase<ArrayResource>)(LocalPointerBase<ArrayResource>)status;
  this = (ArrayResource *)operator_new(0x50);
  ArrayResource::ArrayResource
            (this,bundle,tag,comment,(UErrorCode *)res.super_LocalPointerBase<ArrayResource>.ptr);
  icu_63::LocalPointer<ArrayResource>::LocalPointer
            ((LocalPointer<ArrayResource> *)&local_30,this,
             (UErrorCode *)res.super_LocalPointerBase<ArrayResource>.ptr);
  UVar1 = U_SUCCESS(*(UErrorCode *)res.super_LocalPointerBase<ArrayResource>.ptr);
  if (UVar1 == '\0') {
    local_60 = (ArrayResource *)0x0;
  }
  else {
    local_60 = icu_63::LocalPointerBase<ArrayResource>::orphan(&local_30);
  }
  icu_63::LocalPointer<ArrayResource>::~LocalPointer((LocalPointer<ArrayResource> *)&local_30);
  return local_60;
}

Assistant:

ArrayResource* array_open(struct SRBRoot *bundle, const char *tag, const struct UString* comment, UErrorCode *status) {
    LocalPointer<ArrayResource> res(new ArrayResource(bundle, tag, comment, *status), *status);
    return U_SUCCESS(*status) ? res.orphan() : NULL;
}